

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O1

bool slang::ast::checkFormatString
               (ASTContext *context,StringLiteral *arg,iterator *argIt,iterator argEnd)

{
  ulong uVar1;
  SourceLocation SVar2;
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)> onError;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  string_view str;
  bool ok;
  anon_class_8_1_ba1d5ea0 getRange;
  SourceLocation loc;
  undefined1 local_6a;
  byte local_69;
  Expression **local_68;
  code *local_60;
  ASTContext **ppAStack_58;
  ulong *local_50;
  ulong local_48;
  ASTContext *local_40;
  ulong **local_38;
  ulong **local_30;
  iterator *local_28;
  Expression ***local_20;
  ASTContext *local_18;
  byte *local_10;
  
  uVar5 = (arg->rawValue)._M_len;
  pcVar4 = (arg->rawValue)._M_str;
  if (1 < uVar5) {
    uVar1 = uVar5 - 2;
    uVar5 = uVar5 - 1;
    if (uVar1 <= uVar5) {
      uVar5 = uVar1;
    }
    pcVar4 = pcVar4 + 1;
  }
  SVar2 = (arg->super_Expression).sourceRange.startLoc;
  local_48 = (long)SVar2 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
             (ulong)(SVar2._0_4_ & 0xfffffff);
  local_50 = &local_48;
  local_38 = &local_50;
  local_10 = &local_69;
  local_69 = 1;
  local_20 = &local_68;
  ppAStack_58 = &local_40;
  local_60 = function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
             callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__2>
  ;
  onError.callable = (intptr_t)ppAStack_58;
  onError.callback =
       function_ref<void(slang::DiagCode,unsigned_long,unsigned_long,std::optional<char>)>::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__2>
  ;
  onText.callable = (intptr_t)&local_6a;
  onText.callback =
       function_ref<void(std::basic_string_view<char,std::char_traits<char>>)>::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__0>
  ;
  onArg.callable = (intptr_t)&local_30;
  onArg.callback =
       function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
       ::
       callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__1>
  ;
  str._M_str = pcVar4;
  str._M_len = uVar5;
  local_68 = argEnd._M_current;
  local_40 = context;
  local_30 = local_38;
  local_28 = argIt;
  local_18 = context;
  bVar3 = SFormat::parse(str,onText,onArg,onError);
  return (bool)(bVar3 & local_69);
}

Assistant:

static bool checkFormatString(const ASTContext& context, const StringLiteral& arg,
                              Args::iterator& argIt, Args::iterator argEnd) {
    // Strip quotes from the raw string.
    std::string_view fmt = arg.getRawValue();
    if (fmt.length() >= 2)
        fmt = fmt.substr(1, fmt.length() - 2);

    SourceLocation loc = arg.sourceRange.start() + 1;
    auto getRange = [&](size_t offset, size_t len) {
        SourceLocation sl = loc + offset;
        return SourceRange{sl, sl + len};
    };

    bool ok = true;
    bool parseOk = SFormat::parse(
        fmt, [](std::string_view) {},
        [&](char spec, size_t offset, size_t len, const SFormat::FormatOptions&) {
            // Filter out non-consuming arguments.
            switch (charToLower(spec)) {
                case 'l':
                case 'm':
                    return;
                default:
                    break;
            }

            SourceRange range = getRange(offset, len);
            if (argIt == argEnd) {
                // If we've run out of arguments, this is an error.
                context.addDiag(diag::FormatNoArgument, range) << spec;
                ok = false;
                return;
            }

            auto arg = *argIt++;
            if (arg->kind == ExpressionKind::EmptyArgument) {
                // Empty arguments aren't allowed for format args.
                context.addDiag(diag::FormatEmptyArg, arg->sourceRange) << spec << range;
                ok = false;
                return;
            }

            ok &= checkArgType(context, *arg, spec, range);
        },
        [&](DiagCode code, size_t offset, size_t len, std::optional<char> specifier) {
            auto& diag = context.addDiag(code, getRange(offset, len));
            if (specifier)
                diag << *specifier;
        });

    return ok && parseOk;
}